

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

TValue * index2adr(lua_State *L,int idx)

{
  ulong uVar1;
  ulong uVar2;
  
  if (idx < 1) {
    if (-10000 < idx) {
      return L->top + idx;
    }
    if (idx == -10000) {
      return (TValue *)((ulong)(L->glref).ptr32 + 0x98);
    }
    if (idx == -0x2712) {
      uVar1 = (ulong)(L->glref).ptr32;
      *(uint32_t *)(uVar1 + 0xa0) = (L->env).gcptr32;
      *(undefined4 *)(uVar1 + 0xa4) = 0xfffffff4;
      return (TValue *)(uVar1 + 0xa0);
    }
    uVar1 = (ulong)L->base[-1].u32.lo;
    if (idx == -0x2711) {
      uVar2 = (ulong)(L->glref).ptr32;
      *(undefined4 *)(uVar2 + 0xa0) = *(undefined4 *)(uVar1 + 8);
      *(undefined4 *)(uVar2 + 0xa4) = 0xfffffff4;
      return (TValue *)(uVar2 + 0xa0);
    }
    if (-idx - 0x2712U <= (uint)*(byte *)(uVar1 + 7)) {
      return (TValue *)(uVar1 + (long)(-0x2713 - idx) * 8 + 0x20);
    }
  }
  else if (L->base + ((ulong)(uint)idx - 1) < L->top) {
    return L->base + ((ulong)(uint)idx - 1);
  }
  return (TValue *)((ulong)(L->glref).ptr32 + 0x68);
}

Assistant:

static TValue *index2adr(lua_State *L, int idx)
{
  if (idx > 0) {
    TValue *o = L->base + (idx - 1);
    return o < L->top ? o : niltv(L);
  } else if (idx > LUA_REGISTRYINDEX) {
    api_check(L, idx != 0 && -idx <= L->top - L->base);
    return L->top + idx;
  } else if (idx == LUA_GLOBALSINDEX) {
    TValue *o = &G(L)->tmptv;
    settabV(L, o, tabref(L->env));
    return o;
  } else if (idx == LUA_REGISTRYINDEX) {
    return registry(L);
  } else {
    GCfunc *fn = curr_func(L);
    api_check(L, fn->c.gct == ~LJ_TFUNC && !isluafunc(fn));
    if (idx == LUA_ENVIRONINDEX) {
      TValue *o = &G(L)->tmptv;
      settabV(L, o, tabref(fn->c.env));
      return o;
    } else {
      idx = LUA_GLOBALSINDEX - idx;
      return idx <= fn->c.nupvalues ? &fn->c.upvalue[idx-1] : niltv(L);
    }
  }
}